

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverse.h
# Opt level: O0

bool Gs::Inverse<float>(AffineMatrix4T<float> *inv,AffineMatrix4T<float> *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float *pfVar16;
  float fVar17;
  float d;
  AffineMatrix4T<float> *m_local;
  AffineMatrix4T<float> *inv_local;
  
  fVar17 = Determinant<float>(m);
  if ((fVar17 != 0.0) || (NAN(fVar17))) {
    fVar17 = 1.0 / fVar17;
    pfVar16 = AffineMatrix4T<float>::At(m,1,1);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,2);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,1);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,2);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,0,0);
    *pfVar16 = fVar17 * (fVar1 * fVar2 + fVar3 * -fVar4);
    pfVar16 = AffineMatrix4T<float>::At(m,1,2);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,0);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,2);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,0);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,1,0);
    *pfVar16 = fVar17 * (fVar1 * fVar2 + fVar3 * -fVar4);
    pfVar16 = AffineMatrix4T<float>::At(m,1,0);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,1);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,0);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,1);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,2,0);
    *pfVar16 = fVar17 * (fVar1 * fVar2 + -(fVar3 * fVar4));
    pfVar16 = AffineMatrix4T<float>::At(m,2,1);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,2);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,1);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,2);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,0,1);
    *pfVar16 = fVar17 * (fVar1 * fVar2 + fVar3 * -fVar4);
    pfVar16 = AffineMatrix4T<float>::At(m,2,2);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,0);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,2);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,0);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,1,1);
    *pfVar16 = fVar17 * (fVar1 * fVar2 + fVar3 * -fVar4);
    pfVar16 = AffineMatrix4T<float>::At(m,2,0);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,1);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,0);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,1);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,2,1);
    *pfVar16 = fVar17 * (fVar1 * fVar2 + -(fVar3 * fVar4));
    pfVar16 = AffineMatrix4T<float>::At(m,0,1);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,2);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,1);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,2);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,0,2);
    *pfVar16 = fVar17 * (fVar1 * fVar2 + fVar3 * -fVar4);
    pfVar16 = AffineMatrix4T<float>::At(m,0,2);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,0);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,2);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,0);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,1,2);
    *pfVar16 = fVar17 * (fVar1 * fVar2 + fVar3 * -fVar4);
    pfVar16 = AffineMatrix4T<float>::At(m,0,0);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,1);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,0);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,1);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,2,2);
    *pfVar16 = fVar17 * (fVar1 * fVar2 + -(fVar3 * fVar4));
    pfVar16 = AffineMatrix4T<float>::At(m,0,1);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,2);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,3);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,2);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,3);
    fVar5 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,1);
    fVar6 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,2);
    fVar7 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,3);
    fVar8 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,2);
    fVar9 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,3);
    fVar10 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,1);
    fVar11 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,2);
    fVar12 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,3);
    fVar13 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,2);
    fVar14 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,3);
    fVar15 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,0,3);
    *pfVar16 = fVar17 * (fVar11 * (fVar12 * fVar13 + -(fVar14 * fVar15)) +
                        fVar1 * (fVar2 * fVar3 + -(fVar4 * fVar5)) +
                        fVar6 * (fVar7 * fVar8 + -(fVar9 * fVar10)));
    pfVar16 = AffineMatrix4T<float>::At(m,0,2);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,0);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,3);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,0);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,3);
    fVar5 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,2);
    fVar6 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,0);
    fVar7 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,3);
    fVar8 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,0);
    fVar9 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,3);
    fVar10 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,2);
    fVar11 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,0);
    fVar12 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,3);
    fVar13 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,0);
    fVar14 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,3);
    fVar15 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,1,3);
    *pfVar16 = fVar17 * (fVar11 * (fVar12 * fVar13 + -(fVar14 * fVar15)) +
                        fVar1 * (fVar2 * fVar3 + -(fVar4 * fVar5)) +
                        fVar6 * (fVar7 * fVar8 + -(fVar9 * fVar10)));
    pfVar16 = AffineMatrix4T<float>::At(m,0,3);
    fVar1 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,0);
    fVar2 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,1);
    fVar3 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,0);
    fVar4 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,1);
    fVar5 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,3);
    fVar6 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,0);
    fVar7 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,1);
    fVar8 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,0);
    fVar9 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,1);
    fVar10 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,2,3);
    fVar11 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,0);
    fVar12 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,1);
    fVar13 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,0,0);
    fVar14 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(m,1,1);
    fVar15 = *pfVar16;
    pfVar16 = AffineMatrix4T<float>::At(inv,2,3);
    *pfVar16 = fVar17 * (fVar11 * (fVar12 * fVar13 + -(fVar14 * fVar15)) +
                        fVar1 * (fVar2 * fVar3 + -(fVar4 * fVar5)) +
                        fVar6 * (fVar7 * fVar8 + -(fVar9 * fVar10)));
    inv_local._7_1_ = true;
  }
  else {
    inv_local._7_1_ = false;
  }
  return inv_local._7_1_;
}

Assistant:

bool Inverse(AffineMatrix4T<T>& inv, const AffineMatrix4T<T>& m)
{
    /* Compute inverse determinant */
    T d = Determinant(m);

    if (d == T(0))
        return false;

    d = T(1) / d;

    /* Compute inverse matrix */
    inv.At(0, 0) = d * ( m.At(1, 1) * m.At(2, 2) + m.At(2, 1) * ( -m.At(1, 2) ) );
    inv.At(1, 0) = d * ( m.At(1, 2) * m.At(2, 0) + m.At(2, 2) * ( -m.At(1, 0) ) );
    inv.At(2, 0) = d * ( m.At(1, 0) * m.At(2, 1) - m.At(2, 0) * m.At(1, 1) );
  /*inv.At(3, 0) = 0;*/

    inv.At(0, 1) = d * ( m.At(2, 1) * m.At(0, 2) + m.At(0, 1) * ( -m.At(2, 2) ) );
    inv.At(1, 1) = d * ( m.At(2, 2) * m.At(0, 0) + m.At(0, 2) * ( -m.At(2, 0) ) );
    inv.At(2, 1) = d * ( m.At(2, 0) * m.At(0, 1) - m.At(0, 0) * m.At(2, 1) );
  /*inv.At(3, 1) = 0;*/

    inv.At(0, 2) = d * ( m.At(0, 1) * m.At(1, 2) + m.At(1, 1) * ( -m.At(0, 2) ) );
    inv.At(1, 2) = d * ( m.At(0, 2) * m.At(1, 0) + m.At(1, 2) * ( -m.At(0, 0) ) );
    inv.At(2, 2) = d * ( m.At(0, 0) * m.At(1, 1) - m.At(1, 0) * m.At(0, 1) );
  /*inv.At(3, 2) = 0;*/

    inv.At(0, 3) = d * ( m.At(0, 1) * (m.At(2, 2) * m.At(1, 3) - m.At(1, 2) * m.At(2, 3)) + m.At(1, 1) * (m.At(0, 2) * m.At(2, 3) - m.At(2, 2) * m.At(0, 3)) + m.At(2, 1) * (m.At(1, 2) * m.At(0, 3) - m.At(0, 2) * m.At(1, 3)) );
    inv.At(1, 3) = d * ( m.At(0, 2) * (m.At(2, 0) * m.At(1, 3) - m.At(1, 0) * m.At(2, 3)) + m.At(1, 2) * (m.At(0, 0) * m.At(2, 3) - m.At(2, 0) * m.At(0, 3)) + m.At(2, 2) * (m.At(1, 0) * m.At(0, 3) - m.At(0, 0) * m.At(1, 3)) );
    inv.At(2, 3) = d * ( m.At(0, 3) * (m.At(2, 0) * m.At(1, 1) - m.At(1, 0) * m.At(2, 1)) + m.At(1, 3) * (m.At(0, 0) * m.At(2, 1) - m.At(2, 0) * m.At(0, 1)) + m.At(2, 3) * (m.At(1, 0) * m.At(0, 1) - m.At(0, 0) * m.At(1, 1)) );
  /*inv.At(3, 3) = 1;*/

    return true;
}